

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverApi.c
# Opt level: O0

Msat_Clause_t * Msat_SolverReadClause(Msat_Solver_t *p,int Num)

{
  int iVar1;
  int nClausesP;
  int Num_local;
  Msat_Solver_t *p_local;
  
  if (Num < p->nClauses) {
    iVar1 = Msat_ClauseVecReadSize(p->vClauses);
    if (Num < iVar1) {
      p_local = (Msat_Solver_t *)Msat_ClauseVecReadEntry(p->vClauses,Num);
    }
    else {
      p_local = (Msat_Solver_t *)Msat_ClauseVecReadEntry(p->vLearned,Num - iVar1);
    }
    return (Msat_Clause_t *)p_local;
  }
  __assert_fail("Num < p->nClauses",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatSolverApi.c"
                ,0x56,"Msat_Clause_t *Msat_SolverReadClause(Msat_Solver_t *, int)");
}

Assistant:

Msat_Clause_t * Msat_SolverReadClause( Msat_Solver_t * p, int Num )
{
    int nClausesP;
    assert( Num < p->nClauses );
    nClausesP = Msat_ClauseVecReadSize( p->vClauses );
    if ( Num < nClausesP )
        return Msat_ClauseVecReadEntry( p->vClauses, Num );
    return Msat_ClauseVecReadEntry( p->vLearned, Num - nClausesP );
}